

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_blob_detection.cpp
# Opt level: O1

void addTests_Blob_Detection(UnitTestFramework *framework)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"blob_detection::Detect one blob","");
  UnitTestFramework::add(framework,blob_detection::Detect1Blob,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addTests_Blob_Detection( UnitTestFramework & framework )
{
    framework.add( blob_detection::Detect1Blob, "blob_detection::Detect one blob" );
}